

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

ByteData * __thiscall
cfd::ConfidentialTransactionContext::CreateSignatureHash
          (ConfidentialTransactionContext *this,OutPoint *outpoint,Pubkey *pubkey,
          SigHashType *sighash_type,ConfidentialValue *value,WitnessVersion version)

{
  uint32_t txin_index;
  Pubkey *in_RCX;
  undefined8 in_RDX;
  ConfidentialTransaction *in_RSI;
  ByteData *in_RDI;
  SigHashType *in_R8;
  ConfidentialValue *in_R9;
  WitnessVersion in_stack_00000008;
  ByteData256 sighash;
  Script script;
  Script *in_stack_ffffffffffffff00;
  ByteData *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  SigHashType local_b4;
  ByteData local_a8;
  ByteData256 local_80;
  Script local_68;
  ConfidentialValue *local_30;
  undefined8 local_18;
  
  this_00 = in_RDI;
  local_30 = in_R9;
  local_18 = in_RDX;
  core::ScriptUtil::CreateP2pkhLockingScript(&local_68,in_RCX);
  txin_index = (*(in_RSI->super_AbstractTransaction)._vptr_AbstractTransaction[0xf])
                         (in_RSI,local_18);
  core::Script::GetData(&local_a8,&local_68);
  core::SigHashType::SigHashType(&local_b4,in_R8);
  core::ConfidentialTransaction::GetElementsSignatureHash
            (&local_80,in_RSI,txin_index,&local_a8,&local_b4,local_30,in_stack_00000008);
  core::ByteData::~ByteData((ByteData *)0x556013);
  core::ByteData256::GetBytes(&local_d0,&local_80);
  core::ByteData::ByteData(this_00,&local_d0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this_00->data_);
  core::ByteData256::~ByteData256((ByteData256 *)0x55604f);
  core::Script::~Script(in_stack_ffffffffffffff00);
  return in_RDI;
}

Assistant:

ByteData ConfidentialTransactionContext::CreateSignatureHash(
    const OutPoint& outpoint, const Pubkey& pubkey, SigHashType sighash_type,
    const ConfidentialValue& value, WitnessVersion version) const {
  Script script = ScriptUtil::CreateP2pkhLockingScript(pubkey);
  ByteData256 sighash = GetElementsSignatureHash(
      GetTxInIndex(outpoint), script.GetData(), sighash_type, value, version);
  return ByteData(sighash.GetBytes());
}